

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall
QByteArray::toHex(QByteArray *__return_storage_ptr__,QByteArray *this,char separator)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  long size;
  
  lVar5 = (this->d).size;
  if (lVar5 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    size = lVar5 * 3 + -1;
    if (separator == '\0') {
      size = lVar5 * 2;
    }
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray(__return_storage_ptr__,size,Uninitialized);
    pcVar2 = data(__return_storage_ptr__);
    pcVar3 = (this->d).ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = &_empty;
    }
    lVar5 = 0;
    for (uVar4 = 0; uVar4 < (ulong)(this->d).size; uVar4 = uVar4 + 1) {
      pcVar2[lVar5] = "0123456789abcdef"[(byte)pcVar3[uVar4] >> 4];
      lVar1 = lVar5 + 2;
      pcVar2[lVar5 + 1] = "0123456789abcdef"[(byte)pcVar3[uVar4] & 0xf];
      if ((separator != '\0') && (lVar1 < size)) {
        pcVar2[lVar5 + 2] = separator;
        lVar1 = lVar5 + 3;
      }
      lVar5 = lVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::toHex(char separator) const
{
    if (isEmpty())
        return QByteArray();

    const qsizetype length = separator ? (size() * 3 - 1) : (size() * 2);
    QByteArray hex(length, Qt::Uninitialized);
    char *hexData = hex.data();
    const uchar *data = (const uchar *)this->data();
    for (qsizetype i = 0, o = 0; i < size(); ++i) {
        hexData[o++] = QtMiscUtils::toHexLower(data[i] >> 4);
        hexData[o++] = QtMiscUtils::toHexLower(data[i] & 0xf);

        if ((separator) && (o < length))
            hexData[o++] = separator;
    }
    return hex;
}